

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxInputManager.cpp
# Opt level: O1

bool __thiscall
OIS::LinuxInputManager::vendorExist(LinuxInputManager *this,Type iType,string *vendor)

{
  size_t sVar1;
  pointer pJVar2;
  pointer __s2;
  size_t __n;
  int iVar3;
  pointer pJVar4;
  bool bVar5;
  
  if (((iType - OISKeyboard < 2) &&
      (sVar1 = vendor->_M_string_length,
      sVar1 == (this->super_InputManager).mInputSystemName._M_string_length)) &&
     ((sVar1 == 0 ||
      (iVar3 = bcmp((vendor->_M_dataplus)._M_p,
                    (this->super_InputManager).mInputSystemName._M_dataplus._M_p,sVar1), iVar3 == 0)
      ))) {
    bVar5 = this->window != 0;
  }
  else {
    if (iType == OISJoyStick) {
      pJVar4 = (this->unusedJoyStickList).
               super__Vector_base<OIS::JoyStickInfo,_std::allocator<OIS::JoyStickInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      pJVar2 = (this->unusedJoyStickList).
               super__Vector_base<OIS::JoyStickInfo,_std::allocator<OIS::JoyStickInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar5 = pJVar4 == pJVar2;
      if (!bVar5) {
        __s2 = (vendor->_M_dataplus)._M_p;
        sVar1 = vendor->_M_string_length;
        do {
          __n = (pJVar4->vendor)._M_string_length;
          if ((__n == sVar1) &&
             ((__n == 0 || (iVar3 = bcmp((pJVar4->vendor)._M_dataplus._M_p,__s2,__n), iVar3 == 0))))
          {
            if (!bVar5) {
              return true;
            }
            break;
          }
          pJVar4 = pJVar4 + 1;
          bVar5 = pJVar4 == pJVar2;
        } while (!bVar5);
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool LinuxInputManager::vendorExist(Type iType, const std::string& vendor)
{
	if((iType == OISKeyboard || iType == OISMouse) && vendor == mInputSystemName)
	{
		return window ? true : false;
	}
	else if(iType == OISJoyStick)
	{
		for(JoyStickInfoList::iterator i = unusedJoyStickList.begin(); i != unusedJoyStickList.end(); ++i)
			if(i->vendor == vendor)
				return true;
	}

	return false;
}